

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULSM9DS1.cpp
# Opt level: O0

bool __thiscall RTIMULSM9DS1::IMURead(RTIMULSM9DS1 *this)

{
  char cVar1;
  bool bVar2;
  uint64_t uVar3;
  RTFLOAT RVar4;
  int local_30;
  uchar local_2b [3];
  int i;
  uchar compassData [6];
  uchar accelData [6];
  uchar gyroData [6];
  uchar status;
  RTIMULSM9DS1 *this_local;
  
  unique0x10000529 = this;
  bVar2 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                            this->m_accelGyroSlaveAddr,'\x17','\x01',accelData + 4,
                            "Failed to read LSM9DS1 status");
  if (bVar2) {
    if ((accelData[4] & 3) == 0) {
      this_local._7_1_ = false;
    }
    else {
      for (local_30 = 0; local_30 < 6; local_30 = local_30 + 1) {
        cVar1 = (char)local_30;
        bVar2 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                  this->m_accelGyroSlaveAddr,cVar1 + '\x18','\x01',
                                  compassData + (long)local_30 + 4,
                                  "Failed to read LSM9DS1 gyro data");
        if (!bVar2) {
          return false;
        }
        bVar2 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                  this->m_accelGyroSlaveAddr,cVar1 + '(','\x01',
                                  (uchar *)((long)&i + (long)local_30 + 3),
                                  "Failed to read LSM9DS1 accel data");
        if (!bVar2) {
          return false;
        }
        bVar2 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                  this->m_magSlaveAddr,cVar1 + '(','\x01',local_2b + local_30,
                                  "Failed to read LSM9DS1 compass data");
        if (!bVar2) {
          return false;
        }
      }
      uVar3 = RTMath::currentUSecsSinceEpoch();
      (this->super_RTIMU).m_imuData.timestamp = uVar3;
      RTMath::convertToVector
                (compassData + 4,&(this->super_RTIMU).m_imuData.gyro,this->m_gyroScale,false);
      RTMath::convertToVector
                ((uchar *)((long)&i + 3),&(this->super_RTIMU).m_imuData.accel,this->m_accelScale,
                 false);
      RTMath::convertToVector
                (local_2b,&(this->super_RTIMU).m_imuData.compass,this->m_compassScale,false);
      RVar4 = RTVector3::z(&(this->super_RTIMU).m_imuData.gyro);
      RTVector3::setZ(&(this->super_RTIMU).m_imuData.gyro,-RVar4);
      RVar4 = RTVector3::x(&(this->super_RTIMU).m_imuData.accel);
      RTVector3::setX(&(this->super_RTIMU).m_imuData.accel,-RVar4);
      RVar4 = RTVector3::y(&(this->super_RTIMU).m_imuData.accel);
      RTVector3::setY(&(this->super_RTIMU).m_imuData.accel,-RVar4);
      RVar4 = RTVector3::x(&(this->super_RTIMU).m_imuData.compass);
      RTVector3::setX(&(this->super_RTIMU).m_imuData.compass,-RVar4);
      RVar4 = RTVector3::z(&(this->super_RTIMU).m_imuData.compass);
      RTVector3::setZ(&(this->super_RTIMU).m_imuData.compass,-RVar4);
      RTIMU::handleGyroBias(&this->super_RTIMU);
      RTIMU::calibrateAverageCompass(&this->super_RTIMU);
      RTIMU::calibrateAccel(&this->super_RTIMU);
      RTIMU::updateFusion(&this->super_RTIMU);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMULSM9DS1::IMURead()
{
    unsigned char status;
    unsigned char gyroData[6];
    unsigned char accelData[6];
    unsigned char compassData[6];

    if (!m_settings->HALRead(m_accelGyroSlaveAddr, LSM9DS1_STATUS, 1, &status, "Failed to read LSM9DS1 status"))
        return false;

    if ((status & 0x3) == 0)
        return false;

    for (int i = 0; i<6; i++){
        if (!m_settings->HALRead(m_accelGyroSlaveAddr, LSM9DS1_OUT_X_L_G + i, 1, &gyroData[i], "Failed to read LSM9DS1 gyro data"))
            return false;

        if (!m_settings->HALRead(m_accelGyroSlaveAddr, LSM9DS1_OUT_X_L_XL + i, 1, &accelData[i], "Failed to read LSM9DS1 accel data"))
            return false;

        if (!m_settings->HALRead(m_magSlaveAddr, LSM9DS1_MAG_OUT_X_L + i, 1, &compassData[i], "Failed to read LSM9DS1 compass data"))
            return false;
    }


    m_imuData.timestamp = RTMath::currentUSecsSinceEpoch();

    RTMath::convertToVector(gyroData, m_imuData.gyro, m_gyroScale, false);
    RTMath::convertToVector(accelData, m_imuData.accel, m_accelScale, false);
    RTMath::convertToVector(compassData, m_imuData.compass, m_compassScale, false);

    //  sort out gyro axes and correct for bias

    m_imuData.gyro.setZ(-m_imuData.gyro.z());

    //  sort out accel data;

    m_imuData.accel.setX(-m_imuData.accel.x());
    m_imuData.accel.setY(-m_imuData.accel.y());

    //  sort out compass axes

    m_imuData.compass.setX(-m_imuData.compass.x());
    m_imuData.compass.setZ(-m_imuData.compass.z());

    //  now do standard processing

    handleGyroBias();
    calibrateAverageCompass();
    calibrateAccel();

    //  now update the filter

    updateFusion();

    return true;
}